

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

void adjust_inter_to_priority_list
               (Am_Object *inter,Am_Object *owner,Am_Object *owner_window,bool setting_main_priority
               ,bool multiowner,float main_priority,int second_priority,int third_priority)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Priority_List *pAVar4;
  Am_Object *this;
  Am_Value value;
  int local_84;
  Am_Object local_80;
  float local_74;
  Am_Object *local_70;
  Am_Value local_68;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  local_74 = main_priority;
  local_70 = owner;
  pAVar2 = Am_Object::Get(inter,0x68,4);
  Am_Object::Am_Object((Am_Object *)&local_68,pAVar2);
  bVar1 = Am_Object::Valid((Am_Object *)&local_68);
  Am_Object::~Am_Object((Am_Object *)&local_68);
  if (!bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(owner_window);
    Am_Object::Set(inter,0x68,pAVar3,0);
  }
  local_80.data = (Am_Object_Data *)0x0;
  local_68.type = 0;
  local_68.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(inter,0x129,5);
  Am_Value::operator=(&local_68,pAVar2);
  if (local_68.type == 0xa001) {
    Am_Object::operator=(&local_80,&local_68);
  }
  if (!multiowner) {
    bVar1 = Am_Object::Valid(&local_80);
    if (bVar1) {
      bVar1 = Am_Object::operator==(&local_80,owner_window);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&local_80,0x124,4);
        pAVar4 = (Am_Priority_List *)Am_Value::operator_cast_to_void_(pAVar2);
        if (setting_main_priority) {
          this = &local_38;
          Am_Object::Am_Object(this,inter);
          Am_Priority_List::Change_Main_Priority(pAVar4,this,local_74);
        }
        else {
          this = &local_40;
          Am_Object::Am_Object(this,inter);
          Am_Priority_List::Change_Second_Third_Priority(pAVar4,this,second_priority,third_priority)
          ;
        }
        Am_Object::~Am_Object(this);
        goto LAB_001ad3c5;
      }
    }
  }
  bVar1 = Am_Object::Valid(&local_80);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_80,0x124,4);
    pAVar4 = (Am_Priority_List *)Am_Value::operator_cast_to_void_(pAVar2);
    if (pAVar4 != (Am_Priority_List *)0x0) {
      Am_Object::Am_Object(&local_48,inter);
      Am_Priority_List::Delete(pAVar4,&local_48);
      Am_Object::~Am_Object(&local_48);
    }
  }
  if (!multiowner) {
    bVar1 = Am_Object::Valid(owner_window);
    if (bVar1) {
      local_84 = second_priority;
      if (setting_main_priority) {
        pAVar2 = Am_Object::Get(local_70,0x86,1);
        if (pAVar2->type == 2) {
          pAVar2 = Am_Object::Get(local_70,0x86,4);
          local_84 = Am_Value::operator_cast_to_int(pAVar2);
        }
        pAVar2 = Am_Object::Get(local_70,0x85,1);
        if (pAVar2->type == 2) {
          pAVar2 = Am_Object::Get(local_70,0x85,4);
          third_priority = Am_Value::operator_cast_to_int(pAVar2);
        }
      }
      else {
        pAVar2 = Am_Object::Get(inter,0xcd,4);
        local_74 = Am_Value::operator_cast_to_float(pAVar2);
      }
      if (third_priority == -1 || local_84 == -1) {
        Am_Object::Set(inter,0x129,0,1);
      }
      else {
        Am_Object::Am_Object(&local_50,inter);
        Am_Object::Am_Object(&local_58,owner_window);
        add_priority_list_for_window
                  (&local_50,&local_58,local_74,local_84,third_priority,false,false);
        Am_Object::~Am_Object(&local_58);
        Am_Object::~Am_Object(&local_50);
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(owner_window);
        Am_Object::Set(inter,0x129,pAVar3,1);
      }
      goto LAB_001ad3c5;
    }
  }
  Am_Object::Set(inter,0x129,0,1);
LAB_001ad3c5:
  Am_Value::~Am_Value(&local_68);
  Am_Object::~Am_Object(&local_80);
  return;
}

Assistant:

void
adjust_inter_to_priority_list(Am_Object &inter, Am_Object &owner,
                              Am_Object &owner_window,
                              bool setting_main_priority, bool multiowner,
                              float main_priority, int second_priority = -1,
                              int third_priority = -1)
{
  //if window slot not set yet, set it
  if (!Am_Object(inter.Get(Am_WINDOW, Am_NO_DEPENDENCY)).Valid())
    inter.Set(Am_WINDOW, owner_window);
  Am_Priority_List *inter_list;
  Am_Object on_window;
  Am_Value value;
  value = inter.Peek(Am_LAST_WINDOW, Am_NO_DEPENDENCY);
  if (value.type == Am_OBJECT)
    on_window = value;

  //std::cout << "......For inter " << inter << " Multiowner " << multiowner
  //      << " old win " << on_window << " new win " << owner_window
  //      <<std::endl <<std::flush;
  if (!multiowner && on_window.Valid() && on_window == owner_window) {
    // then just change priority in place
    inter_list = Am_Priority_List::Narrow(
        on_window.Get(Am_INTER_LIST, Am_NO_DEPENDENCY));
    if (setting_main_priority) {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Changing main priority of "
                               << inter << " to be " << main_priority << " in "
                               << on_window);
      inter_list->Change_Main_Priority(inter, main_priority);
    } else {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Changing second/third priority of "
                               << inter << " to be (" << second_priority << ","
                               << third_priority << ") in " << on_window);
      inter_list->Change_Second_Third_Priority(inter, second_priority,
                                               third_priority);
    }
  } else { // don't have an old window or new window is different
    if (on_window.Valid()) {
      // then changing windows, remove from old window
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Removing inter " << inter << " from window "
                                             << on_window);
      inter_list = Am_Priority_List::Narrow(
          on_window.Get(Am_INTER_LIST, Am_NO_DEPENDENCY));
      //std::cout << " ~~~Deleting from inter_list " << inter_list <<std::endl;
      if (inter_list)
        inter_list->Delete(inter); // removes inter if there
    }
    if (!multiowner && owner_window.Valid()) { // then add to new list
      Am_Value_Type typ;
      // second_priority is the Am_OWNER_DEPTH of the graphical object
      // (owner) of the interactor, computed by Opal and third is the Am_RANK
      if (setting_main_priority) {
        // then second and third parameters are bogus, have to Get them
        typ = owner.Get_Slot_Type(Am_OWNER_DEPTH);
        if (typ == Am_INT)
          second_priority = owner.Get(Am_OWNER_DEPTH, Am_NO_DEPENDENCY);
        typ = owner.Get_Slot_Type(Am_RANK);
        if (typ == Am_INT)
          third_priority = owner.Get(Am_RANK, Am_NO_DEPENDENCY);
      } else // need to get main_priority
        main_priority = inter.Get(Am_PRIORITY, Am_NO_DEPENDENCY);
      if (second_priority != -1 && third_priority != -1) {
        add_priority_list_for_window(inter, owner_window, main_priority,
                                     second_priority, third_priority, false,
                                     false);
        inter.Set(Am_LAST_WINDOW, owner_window, Am_OK_IF_NOT_THERE);
      } else
        inter.Set(Am_LAST_WINDOW, 0, Am_OK_IF_NOT_THERE);
    } else
      inter.Set(Am_LAST_WINDOW, 0, Am_OK_IF_NOT_THERE);
  }
}